

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formdata.c
# Opt level: O3

CURLFORMcode curl_formadd(curl_httppost **httppost,curl_httppost **last_post,...)

{
  char *pcVar1;
  long lVar2;
  curl_slist *pcVar3;
  char *pcVar4;
  void *pvVar5;
  bool bVar6;
  bool bVar7;
  curl_strdup_callback p_Var8;
  char in_AL;
  int iVar9;
  long *plVar10;
  long *plVar11;
  void **ppvVar12;
  size_t sVar13;
  size_t sVar14;
  char *pcVar15;
  curl_httppost *pcVar16;
  curl_httppost *pcVar17;
  uint uVar18;
  undefined8 in_RCX;
  ulong uVar19;
  curl_httppost **ppcVar20;
  undefined8 in_RDX;
  CURLFORMcode CVar21;
  size_t sVar22;
  char *pcVar23;
  undefined8 in_R8;
  long *plVar24;
  undefined8 in_R9;
  FormInfo *ptr_1;
  int *piVar25;
  long lVar26;
  FormInfo *ptr;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list arg;
  void **local_160;
  ulong local_150;
  char *local_148;
  char *local_140;
  void *local_e8 [4];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_160 = &arg[0].overflow_arg_area;
  uVar18 = 0x10;
  local_e8[2] = (void *)in_RDX;
  local_e8[3] = (void *)in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  plVar10 = (long *)(*Curl_ccalloc)(1,0x80);
  if (plVar10 == (long *)0x0) {
    return CURL_FORMADD_MEMORY;
  }
  pcVar15 = (char *)0x0;
  piVar25 = (int *)0x0;
  CVar21 = CURL_FORMADD_OK;
  plVar24 = plVar10;
  bVar6 = false;
switchD_004a58b0_caseD_9:
  plVar11 = plVar10;
  if (CVar21 == CURL_FORMADD_OK) {
    if ((bool)(piVar25 != (int *)0x0 & bVar6)) goto code_r0x004a584c;
    uVar19 = (ulong)uVar18;
    if (uVar19 < 0x29) {
      uVar18 = uVar18 + 8;
      ppvVar12 = (void **)((long)local_e8 + uVar19);
    }
    else {
      ppvVar12 = local_160;
      local_160 = local_160 + 1;
    }
    iVar9 = *(int *)ppvVar12;
    if (iVar9 != 0x11) goto LAB_004a589d;
    local_148 = (char *)0x0;
    plVar24 = plVar10;
    pcVar17 = (curl_httppost *)0x0;
    goto LAB_004a6071;
  }
  do {
    if ((char)plVar11[1] == '\x01') {
      (*Curl_cfree)((void *)*plVar11);
      *plVar11 = 0;
      *(undefined1 *)(plVar11 + 1) = 0;
    }
    if ((char)plVar11[4] == '\x01') {
      (*Curl_cfree)((void *)plVar11[3]);
      plVar11[3] = 0;
      *(undefined1 *)(plVar11 + 4) = 0;
    }
    if ((char)plVar11[7] == '\x01') {
      (*Curl_cfree)((void *)plVar11[6]);
      plVar11[6] = 0;
      *(undefined1 *)(plVar11 + 7) = 0;
    }
    if ((char)plVar11[0xc] == '\x01') {
      (*Curl_cfree)((void *)plVar11[0xb]);
      plVar11[0xb] = 0;
      *(undefined1 *)(plVar11 + 0xc) = 0;
    }
    plVar24 = plVar11 + 0xf;
    plVar11 = (long *)*plVar24;
  } while ((long *)*plVar24 != (long *)0x0);
  goto LAB_004a6035;
code_r0x004a584c:
  iVar9 = *piVar25;
  pcVar15 = *(char **)(piVar25 + 2);
  piVar25 = piVar25 + 4;
  CVar21 = CURL_FORMADD_OK;
  bVar6 = false;
  if (iVar9 == 0x11) goto switchD_004a58b0_caseD_9;
  bVar6 = true;
LAB_004a589d:
  CVar21 = CURL_FORMADD_UNKNOWN_OPTION;
  pcVar23 = pcVar15;
  switch(iVar9) {
  case 2:
    *(byte *)(plVar24 + 8) = *(byte *)(plVar24 + 8) | 4;
  case 1:
    CVar21 = CURL_FORMADD_OPTION_TWICE;
    if (*plVar24 == 0) {
      if (!bVar6) {
        uVar19 = (ulong)uVar18;
        if (uVar19 < 0x29) {
          uVar18 = uVar18 + 8;
          ppvVar12 = (void **)((long)local_e8 + uVar19);
        }
        else {
          ppvVar12 = local_160;
          local_160 = local_160 + 1;
        }
        pcVar23 = (char *)*ppvVar12;
      }
      CVar21 = CURL_FORMADD_NULL;
      if (pcVar23 != (char *)0x0) {
        *plVar24 = (long)pcVar23;
        CVar21 = CURL_FORMADD_OK;
      }
    }
    goto switchD_004a58b0_caseD_9;
  case 3:
    CVar21 = CURL_FORMADD_OPTION_TWICE;
    if (plVar24[2] == 0) {
      if (!bVar6) {
        uVar19 = (ulong)uVar18;
        if (uVar19 < 0x29) {
          uVar18 = uVar18 + 8;
          ppvVar12 = (void **)((long)local_e8 + uVar19);
        }
        else {
          ppvVar12 = local_160;
          local_160 = local_160 + 1;
        }
        pcVar23 = (char *)*ppvVar12;
      }
      plVar24[2] = (long)pcVar23;
      CVar21 = CURL_FORMADD_OK;
    }
    goto switchD_004a58b0_caseD_9;
  case 5:
    *(byte *)(plVar24 + 8) = *(byte *)(plVar24 + 8) | 8;
  case 4:
    CVar21 = CURL_FORMADD_OPTION_TWICE;
    if (plVar24[3] != 0) goto switchD_004a58b0_caseD_9;
    if (!bVar6) {
      uVar19 = (ulong)uVar18;
      if (uVar19 < 0x29) {
        uVar18 = uVar18 + 8;
        ppvVar12 = (void **)((long)local_e8 + uVar19);
      }
      else {
        ppvVar12 = local_160;
        local_160 = local_160 + 1;
      }
      pcVar23 = (char *)*ppvVar12;
    }
    CVar21 = CURL_FORMADD_NULL;
    if (pcVar23 == (char *)0x0) goto switchD_004a58b0_caseD_9;
    break;
  case 6:
    CVar21 = CURL_FORMADD_OPTION_TWICE;
    if (plVar24[5] == 0) {
      if (!bVar6) {
        uVar19 = (ulong)uVar18;
        if (uVar19 < 0x29) {
          uVar18 = uVar18 + 8;
          ppvVar12 = (void **)((long)local_e8 + uVar19);
        }
        else {
          ppvVar12 = local_160;
          local_160 = local_160 + 1;
        }
        pcVar23 = (char *)*ppvVar12;
      }
      plVar24[5] = (long)pcVar23;
      CVar21 = CURL_FORMADD_OK;
    }
    goto switchD_004a58b0_caseD_9;
  case 7:
    CVar21 = CURL_FORMADD_OPTION_TWICE;
    if ((*(byte *)(plVar24 + 8) & 10) != 0) goto switchD_004a58b0_caseD_9;
    if (!bVar6) {
      uVar19 = (ulong)uVar18;
      if (uVar19 < 0x29) {
        uVar18 = uVar18 + 8;
        ppvVar12 = (void **)((long)local_e8 + uVar19);
      }
      else {
        ppvVar12 = local_160;
        local_160 = local_160 + 1;
      }
      pcVar23 = (char *)*ppvVar12;
    }
    CVar21 = CURL_FORMADD_NULL;
    if (pcVar23 == (char *)0x0) goto switchD_004a58b0_caseD_9;
    pcVar23 = (*Curl_cstrdup)(pcVar23);
    plVar24[3] = (long)pcVar23;
    CVar21 = CURL_FORMADD_MEMORY;
    if (pcVar23 == (char *)0x0) goto switchD_004a58b0_caseD_9;
    *(byte *)(plVar24 + 8) = *(byte *)(plVar24 + 8) | 2;
    goto LAB_004a5f93;
  case 8:
    CVar21 = CURL_FORMADD_ILLEGAL_ARRAY;
    bVar7 = !bVar6;
    bVar6 = true;
    if (bVar7) {
      uVar19 = (ulong)uVar18;
      if (uVar19 < 0x29) {
        uVar18 = uVar18 + 8;
        ppvVar12 = (void **)((long)local_e8 + uVar19);
      }
      else {
        ppvVar12 = local_160;
        local_160 = local_160 + 1;
      }
      piVar25 = (int *)*ppvVar12;
      bVar6 = piVar25 != (int *)0x0;
      CVar21 = (uint)(piVar25 == (int *)0x0) * 3;
    }
  default:
    goto switchD_004a58b0_caseD_9;
  case 10:
    if (!bVar6) {
      uVar19 = (ulong)uVar18;
      if (uVar19 < 0x29) {
        uVar18 = uVar18 + 8;
        ppvVar12 = (void **)((long)local_e8 + uVar19);
      }
      else {
        ppvVar12 = local_160;
        local_160 = local_160 + 1;
      }
      pcVar23 = (char *)*ppvVar12;
    }
    if (plVar24[3] != 0) {
      CVar21 = CURL_FORMADD_OPTION_TWICE;
      if (((*(byte *)(plVar24 + 8) & 1) == 0) ||
         (CVar21 = CURL_FORMADD_NULL, pcVar23 == (char *)0x0)) goto switchD_004a58b0_caseD_9;
      local_148 = (*Curl_cstrdup)(pcVar23);
      CVar21 = CURL_FORMADD_MEMORY;
      if (local_148 == (char *)0x0) goto switchD_004a58b0_caseD_9;
      plVar11 = (long *)(*Curl_ccalloc)(1,0x80);
      if (plVar11 == (long *)0x0) goto LAB_004a5f9f;
      plVar11[3] = (long)local_148;
      plVar11[8] = 1;
      plVar11[0xf] = plVar24[0xf];
      plVar24[0xf] = (long)plVar11;
      *(undefined1 *)(plVar11 + 4) = 1;
      goto LAB_004a5d93;
    }
    CVar21 = CURL_FORMADD_NULL;
    if (pcVar23 == (char *)0x0) goto switchD_004a58b0_caseD_9;
    pcVar23 = (*Curl_cstrdup)(pcVar23);
    plVar24[3] = (long)pcVar23;
    CVar21 = CURL_FORMADD_MEMORY;
    if (pcVar23 == (char *)0x0) goto switchD_004a58b0_caseD_9;
    *(byte *)(plVar24 + 8) = *(byte *)(plVar24 + 8) | 1;
LAB_004a5f93:
    *(undefined1 *)(plVar24 + 4) = 1;
    CVar21 = CURL_FORMADD_OK;
    goto switchD_004a58b0_caseD_9;
  case 0xb:
  case 0x10:
    if (!bVar6) {
      uVar19 = (ulong)uVar18;
      if (uVar19 < 0x29) {
        uVar18 = uVar18 + 8;
        ppvVar12 = (void **)((long)local_e8 + uVar19);
      }
      else {
        ppvVar12 = local_160;
        local_160 = local_160 + 1;
      }
      pcVar23 = (char *)*ppvVar12;
    }
    CVar21 = CURL_FORMADD_OPTION_TWICE;
    if (plVar24[0xb] == 0) {
      pcVar23 = (*Curl_cstrdup)(pcVar23);
      plVar24[0xb] = (long)pcVar23;
      CVar21 = CURL_FORMADD_MEMORY;
      if (pcVar23 != (char *)0x0) {
        *(undefined1 *)(plVar24 + 0xc) = 1;
        CVar21 = CURL_FORMADD_OK;
      }
    }
    goto switchD_004a58b0_caseD_9;
  case 0xc:
    *(byte *)(plVar24 + 8) = *(byte *)(plVar24 + 8) | 0x30;
    CVar21 = CURL_FORMADD_OPTION_TWICE;
    if (plVar24[9] != 0) goto switchD_004a58b0_caseD_9;
    if (!bVar6) {
      uVar19 = (ulong)uVar18;
      if (uVar19 < 0x29) {
        uVar18 = uVar18 + 8;
        ppvVar12 = (void **)((long)local_e8 + uVar19);
      }
      else {
        ppvVar12 = local_160;
        local_160 = local_160 + 1;
      }
      pcVar23 = (char *)*ppvVar12;
    }
    CVar21 = CURL_FORMADD_NULL;
    if (pcVar23 == (char *)0x0) goto switchD_004a58b0_caseD_9;
    plVar24[9] = (long)pcVar23;
    break;
  case 0xd:
    CVar21 = CURL_FORMADD_OPTION_TWICE;
    if (plVar24[10] == 0) {
      if (!bVar6) {
        uVar19 = (ulong)uVar18;
        if (uVar19 < 0x29) {
          uVar18 = uVar18 + 8;
          ppvVar12 = (void **)((long)local_e8 + uVar19);
        }
        else {
          ppvVar12 = local_160;
          local_160 = local_160 + 1;
        }
        pcVar23 = (char *)*ppvVar12;
      }
      plVar24[10] = (long)pcVar23;
      CVar21 = CURL_FORMADD_OK;
    }
    goto switchD_004a58b0_caseD_9;
  case 0xe:
    if (!bVar6) {
      uVar19 = (ulong)uVar18;
      if (uVar19 < 0x29) {
        uVar18 = uVar18 + 8;
        ppvVar12 = (void **)((long)local_e8 + uVar19);
      }
      else {
        ppvVar12 = local_160;
        local_160 = local_160 + 1;
      }
      pcVar23 = (char *)*ppvVar12;
    }
    if (plVar24[6] == 0) {
      CVar21 = CURL_FORMADD_NULL;
      if (pcVar23 != (char *)0x0) {
        pcVar23 = (*Curl_cstrdup)(pcVar23);
        plVar24[6] = (long)pcVar23;
        CVar21 = CURL_FORMADD_MEMORY;
        if (pcVar23 != (char *)0x0) {
          *(undefined1 *)(plVar24 + 7) = 1;
          CVar21 = CURL_FORMADD_OK;
        }
      }
      goto switchD_004a58b0_caseD_9;
    }
    CVar21 = CURL_FORMADD_OPTION_TWICE;
    if (((*(byte *)(plVar24 + 8) & 1) == 0) || (CVar21 = CURL_FORMADD_NULL, pcVar23 == (char *)0x0))
    goto switchD_004a58b0_caseD_9;
    local_148 = (*Curl_cstrdup)(pcVar23);
    CVar21 = CURL_FORMADD_MEMORY;
    if (local_148 == (char *)0x0) goto switchD_004a58b0_caseD_9;
    plVar11 = (long *)(*Curl_ccalloc)(1,0x80);
    if (plVar11 == (long *)0x0) {
LAB_004a5f9f:
      CVar21 = CURL_FORMADD_MEMORY;
      (*Curl_cfree)(local_148);
      goto switchD_004a58b0_caseD_9;
    }
    plVar11[6] = (long)local_148;
    plVar11[8] = 1;
    plVar11[0xf] = plVar24[0xf];
    plVar24[0xf] = (long)plVar11;
    *(undefined1 *)(plVar11 + 7) = 1;
LAB_004a5d93:
    CVar21 = CURL_FORMADD_OK;
    plVar24 = plVar11;
    goto switchD_004a58b0_caseD_9;
  case 0xf:
    if (!bVar6) {
      uVar19 = (ulong)uVar18;
      if (uVar19 < 0x29) {
        uVar18 = uVar18 + 8;
        ppvVar12 = (void **)((long)local_e8 + uVar19);
      }
      else {
        ppvVar12 = local_160;
        local_160 = local_160 + 1;
      }
      pcVar23 = (char *)*ppvVar12;
    }
    CVar21 = CURL_FORMADD_OPTION_TWICE;
    if (plVar24[0xe] == 0) {
      plVar24[0xe] = (long)pcVar23;
      CVar21 = CURL_FORMADD_OK;
    }
    goto switchD_004a58b0_caseD_9;
  case 0x13:
    *(byte *)(plVar24 + 8) = *(byte *)(plVar24 + 8) | 0x40;
    CVar21 = CURL_FORMADD_OPTION_TWICE;
    if (plVar24[0xd] != 0) goto switchD_004a58b0_caseD_9;
    if (!bVar6) {
      uVar19 = (ulong)uVar18;
      if (uVar19 < 0x29) {
        uVar18 = uVar18 + 8;
        ppvVar12 = (void **)((long)local_e8 + uVar19);
      }
      else {
        ppvVar12 = local_160;
        local_160 = local_160 + 1;
      }
      pcVar23 = (char *)*ppvVar12;
    }
    CVar21 = CURL_FORMADD_NULL;
    if (pcVar23 == (char *)0x0) goto switchD_004a58b0_caseD_9;
    plVar24[0xd] = (long)pcVar23;
  }
  plVar24[3] = (long)pcVar23;
  CVar21 = CURL_FORMADD_OK;
  goto switchD_004a58b0_caseD_9;
LAB_004a6071:
  p_Var8 = Curl_cstrdup;
  if (*plVar24 == 0) {
    if (pcVar17 == (curl_httppost *)0x0) goto LAB_004a63dc;
LAB_004a6090:
    local_150 = plVar24[8];
    CVar21 = CURL_FORMADD_INCOMPLETE;
    if (((((plVar24[5] != 0 & (byte)local_150) != 0) ||
         (uVar18 = (uint)local_150, (uVar18 & 9) == 9)) || ((~uVar18 & 10) == 0)) ||
       ((~uVar18 & 0x30) == 0 && plVar24[9] == 0)) goto LAB_004a63e1;
    if (((local_150 & 0x11) != 0) && (plVar24[6] == 0)) {
      pcVar15 = *(char **)((long)plVar24 + (ulong)(uVar18 & 0x10) * 4 + 0x18);
      pcVar23 = local_148;
      if (local_148 == (char *)0x0) {
        pcVar23 = "application/octet-stream";
      }
      if (pcVar15 != (char *)0x0) {
        lVar26 = 8;
        do {
          sVar13 = strlen(pcVar15);
          pcVar1 = *(char **)(&UNK_005d0988 + lVar26);
          sVar14 = strlen(pcVar1);
          if ((sVar14 <= sVar13) &&
             (iVar9 = curl_strequal(pcVar15 + (sVar13 - sVar14),pcVar1), iVar9 != 0)) {
            pcVar23 = *(char **)((long)&ContentTypeForFilename_ctts + lVar26);
            break;
          }
          lVar26 = lVar26 + 0x10;
        } while (lVar26 != 0x68);
      }
      pcVar15 = (*p_Var8)(pcVar23);
      plVar24[6] = (long)pcVar15;
      if (pcVar15 != (char *)0x0) {
        *(undefined1 *)(plVar24 + 7) = 1;
        local_150 = plVar24[8];
        goto LAB_004a61b4;
      }
LAB_004a63d5:
      CVar21 = CURL_FORMADD_MEMORY;
      goto LAB_004a63e1;
    }
LAB_004a61b4:
    if (plVar24 == plVar10 && (local_150 & 4) == 0) {
      pcVar15 = (char *)*plVar24;
      CVar21 = CURL_FORMADD_MEMORY;
      if (pcVar15 == (char *)0x0) goto LAB_004a63e1;
      sVar22 = plVar24[2];
      if (sVar22 == 0) {
        sVar13 = strlen(pcVar15);
        sVar22 = sVar13 + 1;
      }
      pcVar15 = Curl_memdup(pcVar15,sVar22);
      *plVar24 = (long)pcVar15;
      if (pcVar15 == (char *)0x0) goto LAB_004a63e1;
      *(undefined1 *)(plVar24 + 1) = 1;
      local_150 = plVar24[8];
    }
    local_140 = (char *)plVar24[3];
    if ((local_150 & 0x6b) == 0) {
      if (local_140 == (char *)0x0) {
        local_140 = (char *)0x0;
      }
      else {
        sVar22 = plVar24[5];
        if (sVar22 == 0) {
          sVar13 = strlen(local_140);
          sVar22 = sVar13 + 1;
        }
        local_140 = Curl_memdup(local_140,sVar22);
        plVar24[3] = (long)local_140;
        if (local_140 == (char *)0x0) goto LAB_004a63d5;
        *(undefined1 *)(plVar24 + 4) = 1;
        local_150 = plVar24[8];
      }
    }
    pcVar15 = (char *)*plVar24;
    sVar13 = plVar24[2];
    lVar26 = plVar24[5];
    pcVar23 = (char *)plVar24[9];
    lVar2 = plVar24[10];
    pcVar1 = (char *)plVar24[6];
    pcVar3 = (curl_slist *)plVar24[0xe];
    pcVar4 = (char *)plVar24[0xb];
    pvVar5 = (void *)plVar24[0xd];
    pcVar16 = (curl_httppost *)(*Curl_ccalloc)(1,0x68);
    if (pcVar16 == (curl_httppost *)0x0) goto LAB_004a63d5;
    pcVar16->name = pcVar15;
    if (pcVar15 == (char *)0x0) {
      sVar13 = 0;
    }
    else if (sVar13 == 0) {
      sVar13 = strlen(pcVar15);
    }
    pcVar16->namelength = sVar13;
    pcVar16->contents = local_140;
    pcVar16->contentslength = lVar26;
    pcVar16->buffer = pcVar23;
    pcVar16->bufferlength = lVar2;
    pcVar16->contenttype = pcVar1;
    pcVar16->contentheader = pcVar3;
    pcVar16->showfilename = pcVar4;
    pcVar16->userp = pvVar5;
    pcVar16->flags = local_150;
    if (pcVar17 == (curl_httppost *)0x0) {
      pcVar17 = *last_post;
      if (*last_post == (curl_httppost *)0x0) {
        pcVar17 = (curl_httppost *)httppost;
      }
      pcVar17->next = pcVar16;
      ppcVar20 = last_post;
    }
    else {
      pcVar16->more = pcVar17->more;
      ppcVar20 = &pcVar17->more;
    }
    *ppcVar20 = pcVar16;
    if ((char *)plVar24[6] != (char *)0x0) {
      local_148 = (char *)plVar24[6];
    }
    plVar24 = (long *)plVar24[0xf];
    CVar21 = CURL_FORMADD_OK;
    pcVar17 = pcVar16;
    if (plVar24 == (long *)0x0) goto LAB_004a6035;
    goto LAB_004a6071;
  }
  if (plVar24[3] != 0 || pcVar17 != (curl_httppost *)0x0) goto LAB_004a6090;
LAB_004a63dc:
  CVar21 = CURL_FORMADD_INCOMPLETE;
LAB_004a63e1:
  do {
    if ((char)plVar24[1] == '\x01') {
      (*Curl_cfree)((void *)*plVar24);
      *plVar24 = 0;
      *(undefined1 *)(plVar24 + 1) = 0;
    }
    if ((char)plVar24[4] == '\x01') {
      (*Curl_cfree)((void *)plVar24[3]);
      plVar24[3] = 0;
      *(undefined1 *)(plVar24 + 4) = 0;
    }
    if ((char)plVar24[7] == '\x01') {
      (*Curl_cfree)((void *)plVar24[6]);
      plVar24[6] = 0;
      *(undefined1 *)(plVar24 + 7) = 0;
    }
    if ((char)plVar24[0xc] == '\x01') {
      (*Curl_cfree)((void *)plVar24[0xb]);
      plVar24[0xb] = 0;
      *(undefined1 *)(plVar24 + 0xc) = 0;
    }
    plVar24 = (long *)plVar24[0xf];
  } while (plVar24 != (long *)0x0);
LAB_004a6035:
  do {
    plVar24 = (long *)plVar10[0xf];
    (*Curl_cfree)(plVar10);
    plVar10 = plVar24;
  } while (plVar24 != (long *)0x0);
  return CVar21;
}

Assistant:

CURLFORMcode curl_formadd(struct curl_httppost **httppost,
                          struct curl_httppost **last_post,
                          ...)
{
  va_list arg;
  CURLFORMcode result;
  va_start(arg, last_post);
  result = FormAdd(httppost, last_post, arg);
  va_end(arg);
  return result;
}